

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O1

void __thiscall
powerpc_test_cpu::test_one_vector
          (powerpc_test_cpu *this,uint32_t *code,vector_test_t *vt,uint8_t *rAp,uint8_t *rBp,
          uint8_t *rCp)

{
  return;
}

Assistant:

void powerpc_test_cpu::test_one_vector(uint32_t *code, vector_test_t const & vt, uint8_t *rAp, uint8_t *rBp, uint8_t *rCp)
{
#if TEST_VMX_OPS
	static vector_t native_vD;
	memset(&native_vD, 0, sizeof(native_vD));
	static vector_helper_t native_vSCR;
	memset(&native_vSCR, 0, sizeof(native_vSCR));
	static aligned_vector_t dummy_vector;
	dummy_vector.clear();
	if (!rAp) rAp = (uint8_t *)dummy_vector.addr();
	if (!rBp) rBp = (uint8_t *)dummy_vector.addr();
	if (!rCp) rCp = (uint8_t *)dummy_vector.addr();
#ifdef NATIVE_POWERPC
	// Invoke native code
	const uint32_t save_cr = native_get_cr();
	native_set_cr(init_cr);
	native_vSCR.w[3] = 0;
	typedef void (*func_t)(uint8_t *, uint8_t *, uint8_t *, uint8_t *, uint8_t *);
	func_t func = (func_t)code;
	func((uint8_t *)&native_vD, rAp, rBp, rCp, native_vSCR.b);
	const uint32_t native_cr = native_get_cr();
	const uint32_t native_vscr = native_vSCR.w[3];
	native_set_cr(save_cr);
	if (results_file) {
		put_vector(native_vD);
		put32(native_cr);
		put32(native_vscr);
	}
#else
	get_vector(native_vD);
	const uint32_t native_cr = get32();
	const uint32_t native_vscr = get32();
#endif

	if (SKIP_VMX_OPS)
		return;

	// Invoke emulated code
	static aligned_vector_t emul_vD;
	emul_vD.clear();
	static aligned_vector_t emul_vSCR;
	emul_vSCR.clear();
	emul_set_cr(init_cr);
	set_gpr(RD, (uintptr_t)emul_vD.addr());
	set_gpr(RA, (uintptr_t)rAp);
	set_gpr(RB, (uintptr_t)rBp);
	set_gpr(RC, (uintptr_t)rCp);
	set_gpr(VSCR, (uintptr_t)emul_vSCR.addr());
	execute(code);
	vector_helper_t emul_vSCR_helper;
	memcpy(&emul_vSCR_helper, emul_vSCR.addr(), sizeof(vector_t));
	const uint32_t emul_cr = emul_get_cr();
	const uint32_t emul_vscr = ntohl(emul_vSCR_helper.w[3]);

	++tests;

	bool ok = vector_equals(vt.type, native_vD, emul_vD.value())
		&& native_cr == emul_cr
		&& native_vscr == emul_vscr;

	if (!ok) {
		printf("FAIL: %s [%08x]\n", vt.name, vt.opcode);
		errors++;
	}
	else if (verbose) {
		printf("PASS: %s [%08x]\n", vt.name, vt.opcode);
	}

	if (!ok || verbose) {
#if ENABLE_MON
		disass_ppc(stdout, (uintptr_t)code, vt.opcode);
#endif
		char op_type = tolower(vt.op_type);
		if (!op_type)
			op_type = vt.type;
#define PRINT_OPERAND(N, vX, rX)									\
		switch (vt.operands[N]) {									\
		case vX:													\
			printf(#vX " = ");										\
			print_vector(*((vector_t *)rX##p));						\
			printf("\n");											\
			break;													\
		case vI:													\
		case vN:													\
			printf(#vX " = %d\n", vX##_field::extract(vt.opcode));	\
			break;													\
		case rX:													\
			printf(#rX " = %08x", rX##p);							\
			if (rX##p) switch (op_type) {							\
			case 'b': printf(" [%02x]", *rX##p); break;				\
			case 'h': printf(" [%04x]", *((uint16_t *)rX##p)); break;	\
			case 'w': printf(" [%08x]", *((uint32_t *)rX##p)); break;	\
			}														\
			printf("\n");											\
			break;													\
		}
		PRINT_OPERAND(1, vA, rA);
		PRINT_OPERAND(2, vB, rB);
		PRINT_OPERAND(3, vC, rC);
#undef  PRINT_OPERAND
		printf("vD.N = ");
		print_vector(native_vD, vt.type);
		printf("\n");
		printf("vD.E = ");
		print_vector(emul_vD.value(), vt.type);
		printf("\n");
		printf("CR.N = %08x ; VSCR.N = %08x\n", native_cr, native_vscr);
		printf("CR.E = %08x ; VSCR.E = %08x\n", emul_cr, emul_vscr);
	}
#endif
}